

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::operator==(Value *this,Value *other)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  bool local_3b;
  bool local_3a;
  bool local_39;
  int temp;
  Value *other_local;
  Value *this_local;
  
  if ((*(ushort *)&this->field_0x8 & 0xff) == (*(ushort *)&other->field_0x8 & 0xff)) {
    switch(this->field_0x8) {
    case 0:
      this_local._7_1_ = true;
      break;
    case 1:
      this_local._7_1_ = (this->value_).int_ == (other->value_).int_;
      break;
    case 2:
      this_local._7_1_ = (this->value_).int_ == (other->value_).int_;
      break;
    case 3:
      this_local._7_1_ = (this->value_).real_ == (other->value_).real_;
      break;
    case 4:
      local_39 = true;
      if ((this->value_).int_ != (other->value_).int_) {
        local_3a = false;
        if (((other->value_).int_ != 0) && (local_3a = false, (this->value_).int_ != 0)) {
          iVar1 = strcmp((this->value_).string_,(other->value_).string_);
          local_3a = iVar1 == 0;
        }
        local_39 = local_3a;
      }
      this_local._7_1_ = local_39;
      break;
    case 5:
      this_local._7_1_ = ((this->value_).bool_ & 1U) == ((other->value_).bool_ & 1U);
      break;
    case 6:
    case 7:
      sVar2 = std::
              map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              ::size((this->value_).map_);
      sVar3 = std::
              map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              ::size((other->value_).map_);
      local_3b = false;
      if (sVar2 == sVar3) {
        local_3b = std::operator==((this->value_).map_,(other->value_).map_);
      }
      this_local._7_1_ = local_3b;
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                    ,0x207,"bool Json::Value::operator==(const Value &) const");
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Value::operator==(const Value& other) const {
  // if ( type_ != other.type_ )
  // GCC 2.95.3 says:
  // attempt to take address of bit-field structure member `Json::Value::type_'
  // Beats me, but a temp solves the problem.
  int temp = other.type_;
  if (type_ != temp)
    return false;
  switch (type_) {
  case nullValue:
    return true;
  case intValue:
    return value_.int_ == other.value_.int_;
  case uintValue:
    return value_.uint_ == other.value_.uint_;
  case realValue:
    return value_.real_ == other.value_.real_;
  case booleanValue:
    return value_.bool_ == other.value_.bool_;
  case stringValue:
    return (value_.string_ == other.value_.string_) ||
           (other.value_.string_ && value_.string_ &&
            strcmp(value_.string_, other.value_.string_) == 0);
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  case arrayValue:
  case objectValue:
    return value_.map_->size() == other.value_.map_->size() &&
           (*value_.map_) == (*other.value_.map_);
#else
  case arrayValue:
    return value_.array_->compare(*(other.value_.array_)) == 0;
  case objectValue:
    return value_.map_->compare(*(other.value_.map_)) == 0;
#endif
  default:
    JSON_ASSERT_UNREACHABLE;
  }
  return false; // unreachable
}